

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBoxBoxDetector.cpp
# Opt level: O0

int intersectRectQuad2(btScalar *h,btScalar *p,btScalar *ret)

{
  undefined4 *in_RDX;
  undefined4 *in_RSI;
  long in_RDI;
  btScalar *nextq;
  int i;
  btScalar *pr;
  btScalar *pq;
  int sign;
  int dir;
  btScalar *r;
  btScalar *q;
  btScalar buffer [16];
  int nr;
  int nq;
  undefined4 *local_b0;
  undefined4 *local_a8;
  uint local_94;
  undefined4 *local_90;
  undefined4 *local_88;
  int local_80;
  int local_7c;
  undefined4 *local_78;
  undefined4 *local_70;
  undefined4 local_68 [18];
  uint local_20;
  uint local_1c;
  undefined4 *local_18;
  long local_8;
  
  local_1c = 4;
  local_20 = 0;
  local_7c = 0;
  local_78 = in_RDX;
  local_70 = in_RSI;
  local_18 = in_RDX;
  local_8 = in_RDI;
  do {
    if (1 < local_7c) {
LAB_00177e26:
      if (local_70 != local_18) {
        memcpy(local_18,local_70,(long)(int)(local_20 << 1) << 2);
      }
      return local_20;
    }
    for (local_80 = -1; local_80 < 2; local_80 = local_80 + 2) {
      local_88 = local_70;
      local_90 = local_78;
      local_20 = 0;
      for (local_94 = local_1c; 0 < (int)local_94; local_94 = local_94 - 1) {
        if ((float)local_80 * (float)local_88[local_7c] < *(float *)(local_8 + (long)local_7c * 4))
        {
          *local_90 = *local_88;
          local_90[1] = local_88[1];
          local_90 = local_90 + 2;
          local_20 = local_20 + 1;
          if ((local_20 & 8) != 0) {
            local_70 = local_78;
            goto LAB_00177e26;
          }
        }
        if ((int)local_94 < 2) {
          local_a8 = local_70;
        }
        else {
          local_a8 = local_88 + 2;
        }
        if ((float)local_80 * (float)local_88[local_7c] < *(float *)(local_8 + (long)local_7c * 4)
            != (float)local_80 * (float)local_a8[local_7c] <
               *(float *)(local_8 + (long)local_7c * 4)) {
          local_90[1 - local_7c] =
               (((float)local_a8[1 - local_7c] - (float)local_88[1 - local_7c]) /
               ((float)local_a8[local_7c] - (float)local_88[local_7c])) *
               ((float)local_80 * *(float *)(local_8 + (long)local_7c * 4) +
               -(float)local_88[local_7c]) + (float)local_88[1 - local_7c];
          local_90[local_7c] = (float)local_80 * *(float *)(local_8 + (long)local_7c * 4);
          local_90 = local_90 + 2;
          local_20 = local_20 + 1;
          if ((local_20 & 8) != 0) {
            local_70 = local_78;
            goto LAB_00177e26;
          }
        }
        local_88 = local_88 + 2;
      }
      local_70 = local_78;
      if (local_78 == local_18) {
        local_b0 = local_68;
      }
      else {
        local_b0 = local_18;
      }
      local_78 = local_b0;
      local_1c = local_20;
    }
    local_7c = local_7c + 1;
  } while( true );
}

Assistant:

static int intersectRectQuad2 (btScalar h[2], btScalar p[8], btScalar ret[16])
{
  // q (and r) contain nq (and nr) coordinate points for the current (and
  // chopped) polygons
  int nq=4,nr=0;
  btScalar buffer[16];
  btScalar *q = p;
  btScalar *r = ret;
  for (int dir=0; dir <= 1; dir++) {
    // direction notation: xy[0] = x axis, xy[1] = y axis
    for (int sign=-1; sign <= 1; sign += 2) {
      // chop q along the line xy[dir] = sign*h[dir]
      btScalar *pq = q;
      btScalar *pr = r;
      nr = 0;
      for (int i=nq; i > 0; i--) {
	// go through all points in q and all lines between adjacent points
	if (sign*pq[dir] < h[dir]) {
	  // this point is inside the chopping line
	  pr[0] = pq[0];
	  pr[1] = pq[1];
	  pr += 2;
	  nr++;
	  if (nr & 8) {
	    q = r;
	    goto done;
	  }
	}
	btScalar *nextq = (i > 1) ? pq+2 : q;
	if ((sign*pq[dir] < h[dir]) ^ (sign*nextq[dir] < h[dir])) {
	  // this line crosses the chopping line
	  pr[1-dir] = pq[1-dir] + (nextq[1-dir]-pq[1-dir]) /
	    (nextq[dir]-pq[dir]) * (sign*h[dir]-pq[dir]);
	  pr[dir] = sign*h[dir];
	  pr += 2;
	  nr++;
	  if (nr & 8) {
	    q = r;
	    goto done;
	  }
	}
	pq += 2;
      }
      q = r;
      r = (q==ret) ? buffer : ret;
      nq = nr;
    }
  }
 done:
  if (q != ret) memcpy (ret,q,nr*2*sizeof(btScalar));
  return nr;
}